

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Torsion.cpp
# Opt level: O0

void __thiscall
OpenMD::Torsion::Torsion
          (Torsion *this,Atom *atom1,Atom *atom2,Atom *atom3,Atom *atom4,TorsionType *tt)

{
  reference ppAVar1;
  value_type in_RCX;
  value_type in_RDX;
  value_type in_RSI;
  undefined8 *in_RDI;
  value_type in_R8;
  undefined8 in_R9;
  ShortRangeInteraction *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  string *this_00;
  
  ShortRangeInteraction::ShortRangeInteraction(in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__Torsion_00508760;
  in_RDI[0xd] = in_R9;
  this_00 = (string *)(in_RDI + 0xe);
  std::__cxx11::string::string(this_00);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::resize
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)this_00,
             in_stack_ffffffffffffffa8);
  ppAVar1 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 2),0);
  *ppAVar1 = in_RSI;
  ppAVar1 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 2),1);
  *ppAVar1 = in_RDX;
  ppAVar1 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 2),2);
  *ppAVar1 = in_RCX;
  ppAVar1 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 2),3);
  *ppAVar1 = in_R8;
  return;
}

Assistant:

Torsion::Torsion(Atom* atom1, Atom* atom2, Atom* atom3, Atom* atom4,
                   TorsionType* tt) :
      ShortRangeInteraction(),
      torsionType_(tt) {
    atoms_.resize(4);
    atoms_[0] = atom1;
    atoms_[1] = atom2;
    atoms_[2] = atom3;
    atoms_[3] = atom4;
  }